

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O3

unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
wabt::MakeUnique<wabt::ModuleCommand>(void)

{
  undefined8 *__s;
  __uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true> in_RDI;
  
  __s = (undefined8 *)operator_new(0x380);
  memset(__s,0,0x370);
  *__s = &PTR__ModuleCommand_001b90d0;
  __s[2] = 0;
  __s[3] = 0;
  *(undefined8 *)((long)__s + 0x1c) = 0;
  *(undefined8 *)((long)__s + 0x24) = 0;
  __s[6] = __s + 8;
  *(undefined1 *)(__s + 8) = 0;
  __s[10] = 0;
  __s[0xb] = 0;
  __s[0xc] = 0;
  __s[0xd] = 0;
  *(undefined8 *)((long)__s + 0x6c) = 0;
  *(undefined8 *)((long)__s + 0x74) = 0;
  memset(__s + 0x10,0,0x108);
  __s[0x31] = __s + 0x37;
  __s[0x32] = 1;
  __s[0x33] = 0;
  __s[0x34] = 0;
  *(undefined4 *)(__s + 0x35) = 0x3f800000;
  __s[0x36] = 0;
  __s[0x37] = 0;
  __s[0x38] = __s + 0x3e;
  __s[0x39] = 1;
  __s[0x3a] = 0;
  __s[0x3b] = 0;
  *(undefined4 *)(__s + 0x3c) = 0x3f800000;
  __s[0x3d] = 0;
  __s[0x3e] = 0;
  __s[0x3f] = __s + 0x45;
  __s[0x40] = 1;
  __s[0x41] = 0;
  __s[0x42] = 0;
  *(undefined4 *)(__s + 0x43) = 0x3f800000;
  __s[0x44] = 0;
  __s[0x45] = 0;
  __s[0x46] = __s + 0x4c;
  __s[0x47] = 1;
  __s[0x48] = 0;
  __s[0x49] = 0;
  *(undefined4 *)(__s + 0x4a) = 0x3f800000;
  __s[0x4b] = 0;
  __s[0x4c] = 0;
  __s[0x4d] = __s + 0x53;
  __s[0x4e] = 1;
  __s[0x4f] = 0;
  __s[0x50] = 0;
  *(undefined4 *)(__s + 0x51) = 0x3f800000;
  __s[0x52] = 0;
  __s[0x53] = 0;
  __s[0x54] = __s + 0x5a;
  __s[0x55] = 1;
  __s[0x56] = 0;
  __s[0x57] = 0;
  *(undefined4 *)(__s + 0x58) = 0x3f800000;
  __s[0x59] = 0;
  __s[0x5a] = 0;
  __s[0x5b] = __s + 0x61;
  __s[0x5c] = 1;
  __s[0x5d] = 0;
  __s[0x5e] = 0;
  *(undefined4 *)(__s + 0x5f) = 0x3f800000;
  __s[0x60] = 0;
  __s[0x61] = 0;
  __s[0x62] = __s + 0x68;
  __s[99] = 1;
  __s[100] = 0;
  __s[0x65] = 0;
  *(undefined4 *)(__s + 0x66) = 0x3f800000;
  __s[0x67] = 0;
  __s[0x68] = 0;
  __s[0x69] = __s + 0x6f;
  __s[0x6a] = 1;
  __s[0x6b] = 0;
  __s[0x6c] = 0;
  *(undefined4 *)(__s + 0x6d) = 0x3f800000;
  __s[0x6e] = 0;
  __s[0x6f] = 0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
   .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
   super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl = __s;
  return (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
         )(tuple<wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>)
          in_RDI.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}